

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O2

void __thiscall amrex::BoxArray::uniqify(BoxArray *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  long lVar3;
  pointer pBVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  int dir;
  uint uVar11;
  long lVar12;
  int iVar13;
  uint *puVar14;
  ulong uVar15;
  long lVar16;
  IntVect IVar17;
  undefined1 local_48 [32];
  
  p_Var1 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if ((p_Var1 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) || (p_Var1->_M_use_count != 1)
     ) {
    std::make_shared<amrex::BARef,amrex::BARef&>((BARef *)local_48);
    peVar2 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pBVar4 = (pointer)(this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
    (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_48._0_8_;
    (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_;
    local_48._0_8_ = peVar2;
    local_48._8_8_ = pBVar4;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  }
  else {
    clear_hash_bin(this);
  }
  IVar17 = BATransformer::coarsen_ratio(&this->m_bat);
  iVar8 = IVar17.vect[2];
  local_48._16_4_ = IVar17.vect[0];
  local_48._20_4_ = IVar17.vect[1];
  local_48._24_4_ = IVar17.vect[2];
  iVar7 = IVar17.vect[0];
  if ((iVar8 != 1 || iVar7 != 1) || IVar17.vect._0_8_ >> 0x20 != 1) {
    peVar2 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    lVar3 = *(long *)&(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data;
    uVar6 = ((long)*(pointer *)
                    ((long)&(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data + 8) - lVar3) / 0x1c;
    iVar13 = IVar17.vect[1];
    uVar15 = 0;
    uVar9 = uVar6 & 0xffffffff;
    if ((int)uVar6 < 1) {
      uVar9 = uVar15;
    }
    lVar16 = lVar3 + 0xc;
    for (; uVar15 != uVar9; uVar15 = uVar15 + 1) {
      puVar14 = (uint *)(uVar15 * 0x1c + lVar3);
      if (iVar13 == 1 && iVar7 == 1) {
        if (iVar8 != 1) {
          uVar5 = puVar14[1];
          goto LAB_0041abf1;
        }
      }
      else {
        uVar5 = *puVar14;
        if (iVar7 != 1) {
          if (iVar7 == 4) {
            if ((int)uVar5 < 0) {
              uVar5 = (int)uVar5 >> 2;
            }
            else {
              uVar5 = uVar5 >> 2;
            }
          }
          else if (iVar7 == 2) {
            if ((int)uVar5 < 0) {
              uVar5 = (int)uVar5 >> 1;
            }
            else {
              uVar5 = uVar5 >> 1;
            }
          }
          else if ((int)uVar5 < 0) {
            uVar5 = ~((int)~uVar5 / iVar7);
          }
          else {
            uVar5 = (int)uVar5 / iVar7;
          }
        }
        *puVar14 = uVar5;
        uVar5 = puVar14[1];
        if (iVar13 != 1) {
          if (iVar13 == 4) {
            if ((int)uVar5 < 0) {
              uVar5 = (int)uVar5 >> 2;
            }
            else {
              uVar5 = uVar5 >> 2;
            }
          }
          else if (iVar13 == 2) {
            if ((int)uVar5 < 0) {
              uVar5 = (int)uVar5 >> 1;
            }
            else {
              uVar5 = uVar5 >> 1;
            }
          }
          else if ((int)uVar5 < 0) {
            uVar5 = ~((int)~uVar5 / iVar13);
          }
          else {
            uVar5 = (int)uVar5 / iVar13;
          }
        }
LAB_0041abf1:
        puVar14[1] = uVar5;
        uVar5 = puVar14[2];
        if (iVar8 != 1) {
          if (iVar8 == 4) {
            if ((int)uVar5 < 0) {
              uVar5 = (int)uVar5 >> 2;
            }
            else {
              uVar5 = uVar5 >> 2;
            }
          }
          else if (iVar8 == 2) {
            if ((int)uVar5 < 0) {
              uVar5 = (int)uVar5 >> 1;
            }
            else {
              uVar5 = uVar5 >> 1;
            }
          }
          else if ((int)uVar5 < 0) {
            uVar5 = ~((int)~uVar5 / iVar8);
          }
          else {
            uVar5 = (int)uVar5 / iVar8;
          }
        }
        puVar14[2] = uVar5;
        uVar5 = puVar14[6];
        if (uVar5 == 0) {
          uVar5 = puVar14[3];
          if (iVar7 != 1) {
            if (iVar7 == 4) {
              if ((int)uVar5 < 0) {
                uVar5 = (int)uVar5 >> 2;
              }
              else {
                uVar5 = uVar5 >> 2;
              }
            }
            else if (iVar7 == 2) {
              if ((int)uVar5 < 0) {
                uVar5 = (int)uVar5 >> 1;
              }
              else {
                uVar5 = uVar5 >> 1;
              }
            }
            else if ((int)uVar5 < 0) {
              uVar5 = ~((int)~uVar5 / iVar7);
            }
            else {
              uVar5 = (int)uVar5 / iVar7;
            }
          }
          puVar14[3] = uVar5;
          uVar5 = puVar14[4];
          if (iVar13 != 1) {
            if (iVar13 == 4) {
              if ((int)uVar5 < 0) {
                uVar5 = (int)uVar5 >> 2;
              }
              else {
                uVar5 = uVar5 >> 2;
              }
            }
            else if (iVar13 == 2) {
              if ((int)uVar5 < 0) {
                uVar5 = (int)uVar5 >> 1;
              }
              else {
                uVar5 = uVar5 >> 1;
              }
            }
            else if ((int)uVar5 < 0) {
              uVar5 = ~((int)~uVar5 / iVar13);
            }
            else {
              uVar5 = (int)uVar5 / iVar13;
            }
          }
          puVar14[4] = uVar5;
          uVar5 = puVar14[5];
          if (iVar8 != 1) {
            if (iVar8 == 4) {
              if ((int)uVar5 < 0) {
                uVar5 = (int)uVar5 >> 2;
              }
              else {
                uVar5 = uVar5 >> 2;
              }
            }
            else if (iVar8 == 2) {
              if ((int)uVar5 < 0) {
                uVar5 = (int)uVar5 >> 1;
              }
              else {
                uVar5 = uVar5 >> 1;
              }
            }
            else if ((int)uVar5 < 0) {
              uVar5 = ~((int)~uVar5 / iVar8);
            }
            else {
              uVar5 = (int)uVar5 / iVar8;
            }
          }
        }
        else {
          local_48._0_8_ = (pointer)0x0;
          local_48._8_8_ = (ulong)(uint)local_48._12_4_ << 0x20;
          for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
            if (((uVar5 >> ((uint)lVar12 & 0x1f) & 1) != 0) &&
               (*(int *)(lVar16 + lVar12 * 4) % *(int *)(local_48 + lVar12 * 4 + 0x10) != 0)) {
              *(undefined4 *)(local_48 + lVar12 * 4) = 1;
            }
          }
          uVar10 = puVar14[3];
          if (iVar7 != 1) {
            if (iVar7 == 4) {
              if ((int)uVar10 < 0) {
                uVar10 = (int)uVar10 >> 2;
              }
              else {
                uVar10 = uVar10 >> 2;
              }
            }
            else if (iVar7 == 2) {
              if ((int)uVar10 < 0) {
                uVar10 = (int)uVar10 >> 1;
              }
              else {
                uVar10 = uVar10 >> 1;
              }
            }
            else if ((int)uVar10 < 0) {
              uVar10 = ~((int)~uVar10 / iVar7);
            }
            else {
              uVar10 = (int)uVar10 / iVar7;
            }
          }
          uVar11 = puVar14[4];
          if (iVar13 != 1) {
            if (iVar13 == 4) {
              if ((int)uVar11 < 0) {
                uVar11 = (int)uVar11 >> 2;
              }
              else {
                uVar11 = uVar11 >> 2;
              }
            }
            else if (iVar13 == 2) {
              if ((int)uVar11 < 0) {
                uVar11 = (int)uVar11 >> 1;
              }
              else {
                uVar11 = uVar11 >> 1;
              }
            }
            else if ((int)uVar11 < 0) {
              uVar11 = ~((int)~uVar11 / iVar13);
            }
            else {
              uVar11 = (int)uVar11 / iVar13;
            }
          }
          uVar5 = puVar14[5];
          if (iVar8 != 1) {
            if (iVar8 == 4) {
              if ((int)uVar5 < 0) {
                uVar5 = (int)uVar5 >> 2;
              }
              else {
                uVar5 = uVar5 >> 2;
              }
            }
            else if (iVar8 == 2) {
              if ((int)uVar5 < 0) {
                uVar5 = (int)uVar5 >> 1;
              }
              else {
                uVar5 = uVar5 >> 1;
              }
            }
            else if ((int)uVar5 < 0) {
              uVar5 = ~((int)~uVar5 / iVar8);
            }
            else {
              uVar5 = (int)uVar5 / iVar8;
            }
          }
          puVar14[3] = uVar10 + local_48._0_4_;
          puVar14[4] = uVar11 + local_48._4_4_;
          uVar5 = uVar5 + local_48._8_4_;
        }
        puVar14[5] = uVar5;
      }
      lVar16 = lVar16 + 0x1c;
    }
    local_48._0_8_ = (element_type *)0x100000001;
    local_48._8_4_ = 1;
    BATransformer::set_coarsen_ratio(&this->m_bat,(IntVect *)local_48);
  }
  std::__shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->m_simplified_list).
              super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

void
BoxArray::uniqify ()
{
    if (m_ref.use_count() == 1) {
        clear_hash_bin();
    } else {
        auto p = std::make_shared<BARef>(*m_ref);
        std::swap(m_ref,p);
    }
    IntVect cr = crseRatio();
    if (cr != IntVect::TheUnitVector()) {
        const int N = m_ref->m_abox.size();
#ifdef AMREX_USE_OMP
#pragma omp parallel for
#endif
        for (int i = 0; i < N; i++) {
            m_ref->m_abox[i].coarsen(cr);
        }
        m_bat.set_coarsen_ratio(IntVect::TheUnitVector());
    }
    m_simplified_list.reset();
}